

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisCircularDependencies.cpp
# Opt level: O0

void __thiscall
TestFindCircularDependenciesSeesLargeCycle::TestFindCircularDependenciesSeesLargeCycle
          (TestFindCircularDependenciesSeesLargeCycle *this)

{
  Test *in_RDI;
  
  Test::Test(in_RDI,"FindCircularDependenciesSeesLargeCycle");
  in_RDI->_vptr_Test = (_func_int **)&PTR_Run_0018f5d8;
  return;
}

Assistant:

TEST(FindCircularDependenciesSeesLargeCycle) {
  std::unordered_map<std::string, Component *> components;
  Component* a = components["a"] = new Component("a");
  Component* b = components["b"] = new Component("b");
  Component* c = components["c"] = new Component("c");
  Component* d = components["d"] = new Component("d");
  Component* e = components["e"] = new Component("e");
  a->pubDeps.insert(b);
  b->privDeps.insert(c);
  c->pubDeps.insert(d);
  d->privDeps.insert(e);
  e->pubDeps.insert(a);

  FindCircularDependencies(components);

  ASSERT(NodesWithCycles(components) == 5);
  ASSERT(a->circulars.size() == 1);
  ASSERT(*a->circulars.begin() == b);
  ASSERT(b->circulars.size() == 1);
  ASSERT(*b->circulars.begin() == c);
  ASSERT(c->circulars.size() == 1);
  ASSERT(*c->circulars.begin() == d);
  ASSERT(d->circulars.size() == 1);
  ASSERT(*d->circulars.begin() == e);
  ASSERT(e->circulars.size() == 1);
  ASSERT(*e->circulars.begin() == a);
}